

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O0

double __thiscall ParameterReader::getVal(ParameterReader *this,string *name,double defaultValue)

{
  size_type __n;
  const_reference pvVar1;
  ostream *poVar2;
  void *this_00;
  string *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  string *in_stack_00000030;
  ParameterReader *in_stack_00000038;
  long idx;
  string local_48 [32];
  size_type local_28;
  double local_20;
  value_type local_8;
  
  local_20 = in_XMM0_Qa;
  std::__cxx11::string::string(local_48,in_RSI);
  __n = _find(in_stack_00000038,in_stack_00000030);
  std::__cxx11::string::~string(local_48);
  local_28 = __n;
  if (__n == 0xffffffffffffffff) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ParameterReader::getVal error: parameter with name ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2," not found.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"using defaultValue: ");
    this_00 = (void *)std::ostream::operator<<(poVar2,local_20);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_8 = local_20;
  }
  else {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),__n);
    local_8 = *pvVar1;
  }
  return local_8;
}

Assistant:

double ParameterReader::getVal(string name, double defaultValue) const {
    long idx = _find(name);
    if (idx != -1) {
        return values[idx];
    } else {
        cout << "ParameterReader::getVal error: parameter with name " << name
             << " not found." << endl;
        cout << "using defaultValue: " << defaultValue << endl;
        return (defaultValue);
    }
}